

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

wchar_t * fmt::v5::internal::
          format_decimal<unsigned_long,wchar_t,fmt::v5::internal::add_thousands_sep<wchar_t>>
                    (wchar_t *buffer,unsigned_long value,int num_digits,
                    add_thousands_sep<wchar_t> thousands_sep)

{
  wchar_t wVar1;
  wchar_t *local_40;
  wchar_t *local_38;
  
  if (-1 < num_digits) {
    local_40 = buffer + (uint)num_digits;
    local_38 = local_40;
    for (; 99 < value; value = value / 100) {
      local_40[-1] = (int)(char)basic_data<void>::DIGITS[(value % 100) * 2 + 1];
      local_40 = local_40 + -1;
      add_thousands_sep<wchar_t>::operator()(&thousands_sep,&local_40);
      local_40[-1] = (int)(char)basic_data<void>::DIGITS[(value % 100) * 2];
      local_40 = local_40 + -1;
      add_thousands_sep<wchar_t>::operator()(&thousands_sep,&local_40);
    }
    if (value < 10) {
      wVar1 = (uint)value | 0x30;
    }
    else {
      local_40[-1] = (int)(char)basic_data<void>::DIGITS
                                [((value & 0xffffffff) * 2 & 0xffffffff) + 1];
      local_40 = local_40 + -1;
      add_thousands_sep<wchar_t>::operator()(&thousands_sep,&local_40);
      wVar1 = (wchar_t)(char)basic_data<void>::DIGITS[(value & 0xffffffff) * 2];
    }
    local_40[-1] = wVar1;
    return local_38;
  }
  __assert_fail("(num_digits >= 0) && \"invalid digit count\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/tinfoilboy[P]sonne/extern/fmt/include/fmt/format.h"
                ,0x3c0,
                "Char *fmt::internal::format_decimal(Char *, UInt, int, ThousandsSep) [UInt = unsigned long, Char = wchar_t, ThousandsSep = fmt::internal::add_thousands_sep<wchar_t>]"
               );
}

Assistant:

inline Char *format_decimal(Char *buffer, UInt value, int num_digits,
                            ThousandsSep thousands_sep) {
  FMT_ASSERT(num_digits >= 0, "invalid digit count");
  buffer += num_digits;
  Char *end = buffer;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    unsigned index = static_cast<unsigned>((value % 100) * 2);
    value /= 100;
    *--buffer = static_cast<Char>(data::DIGITS[index + 1]);
    thousands_sep(buffer);
    *--buffer = static_cast<Char>(data::DIGITS[index]);
    thousands_sep(buffer);
  }
  if (value < 10) {
    *--buffer = static_cast<Char>('0' + value);
    return end;
  }
  unsigned index = static_cast<unsigned>(value * 2);
  *--buffer = static_cast<Char>(data::DIGITS[index + 1]);
  thousands_sep(buffer);
  *--buffer = static_cast<Char>(data::DIGITS[index]);
  return end;
}